

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::PanIdQuery
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint16_t aPanId,
          string *aDstAddr)

{
  anon_class_80_5_65dac855 local_98;
  AsyncRequest local_48;
  string *local_28;
  string *aDstAddr_local;
  uint16_t aPanId_local;
  ErrorHandler *pEStack_18;
  uint32_t aChannelMask_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_98.this = this;
  local_28 = aDstAddr;
  aDstAddr_local._2_2_ = aPanId;
  aDstAddr_local._4_4_ = aChannelMask;
  pEStack_18 = aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_98.aHandler,aHandler);
  local_98.aChannelMask = aDstAddr_local._4_4_;
  local_98.aPanId = aDstAddr_local._2_2_;
  std::__cxx11::string::string((string *)&local_98.aDstAddr,(string *)local_28);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::PanIdQuery(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_short,std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_48,&local_98);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  PanIdQuery(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_short,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_98);
  return;
}

Assistant:

void CommissionerSafe::PanIdQuery(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint16_t           aPanId,
                                  const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->PanIdQuery(aHandler, aChannelMask, aPanId, aDstAddr); });
}